

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O3

void __thiscall Sampler_ConsistentValues_Test::TestBody(Sampler_ConsistentValues_Test *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  iterator __position;
  pointer pfVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  HaltonSampler *this_00;
  Allocator AVar7;
  undefined8 *puVar8;
  PaddedSobolSampler *pPVar9;
  PMJ02BNSampler *this_01;
  undefined4 *puVar10;
  uint uVar11;
  int s;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  DebugMLTSampler *pDVar17;
  long lVar18;
  Tuple2<pbrt::Point2,_float> *pTVar19;
  Float FVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar21 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar37 [64];
  AssertionResult gtest_ar;
  Point2i resolution;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  vector<float,_std::allocator<float>_> s1d [16];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> s2d [16];
  Tuple2<pbrt::Point2,_float> local_3d8;
  DispatchSplit<8> local_3cd;
  undefined1 local_3cc [4];
  AssertHelper AStack_3c8;
  undefined4 local_3bc;
  Point2<float> local_3b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_3b0;
  undefined4 *local_3a8;
  Tuple2<pbrt::Point2,_int> local_3a0;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_398;
  undefined8 local_378;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  Tuple2<pbrt::Point2,_float> *local_360;
  long local_358;
  long *local_350;
  Float local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  vector<float,_std::allocator<float>_> local_338;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  long alStack_1d0 [3];
  long local_1b8 [49];
  undefined1 auVar22 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a0.x = 100;
  local_3a0.y = 0x65;
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (HaltonSampler *)operator_new(0x48);
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::HaltonSampler::HaltonSampler
            (this_00,0x10,(Point2i *)&local_3a0,
             (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              *)0x0,AVar7);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)this_00 | 0x1000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar8 = (undefined8 *)operator_new(0x18);
  *puVar8 = 0x10;
  puVar8[1] = 0x853c49e6748fea9b;
  puVar8[2] = 0xda3e39cb94b95bdb;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar8 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar9 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar9,0x10,None);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar9 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar9 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar9,0x10,CranleyPatterson);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar9 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar9 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar9,0x10,Xor);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar9 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  pPVar9 = (PaddedSobolSampler *)operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler(pPVar9,0x10,Owen);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)pPVar9 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  this_01 = (PMJ02BNSampler *)operator_new(0x20);
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PMJ02BNSampler::PMJ02BNSampler(this_01,0x10,AVar7);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)this_01 | 0x3000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar8 = (undefined8 *)operator_new(0x30);
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar8 | 0x6000000000000);
  *puVar8 = 0x400000004;
  *(undefined1 *)(puVar8 + 1) = 1;
  *(undefined4 *)((long)puVar8 + 0xc) = 0;
  puVar8[2] = 0x853c49e6748fea9b;
  puVar8[3] = 0xda3e39cb94b95bdb;
  puVar8[4] = 0;
  puVar8[5] = 0;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 0x10;
  *(undefined8 *)(puVar10 + 2) = 0;
  *(undefined8 *)(puVar10 + 4) = 0;
  iVar15 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar15 = local_3a0.x;
  }
  uVar11 = (int)(iVar15 - 1U) >> 1 | iVar15 - 1U;
  uVar11 = (int)uVar11 >> 2 | uVar11;
  uVar11 = (int)uVar11 >> 4 | uVar11;
  uVar11 = (int)uVar11 >> 8 | uVar11;
  puVar10[1] = ((int)uVar11 >> 0x10 | uVar11) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 0x10;
  puVar10[2] = 1;
  *(undefined8 *)(puVar10 + 3) = 0;
  puVar10[5] = 0;
  iVar15 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar15 = local_3a0.x;
  }
  uVar11 = (int)(iVar15 - 1U) >> 1 | iVar15 - 1U;
  uVar11 = (int)uVar11 >> 2 | uVar11;
  uVar11 = (int)uVar11 >> 4 | uVar11;
  uVar11 = (int)uVar11 >> 8 | uVar11;
  puVar10[1] = ((int)uVar11 >> 0x10 | uVar11) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 0x10;
  puVar10[2] = 2;
  *(undefined8 *)(puVar10 + 3) = 0;
  puVar10[5] = 0;
  iVar15 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar15 = local_3a0.x;
  }
  uVar11 = (int)(iVar15 - 1U) >> 1 | iVar15 - 1U;
  uVar11 = (int)uVar11 >> 2 | uVar11;
  uVar11 = (int)uVar11 >> 4 | uVar11;
  uVar11 = (int)uVar11 >> 8 | uVar11;
  puVar10[1] = ((int)uVar11 >> 0x10 | uVar11) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 0x10;
  puVar10[2] = 3;
  *(undefined8 *)(puVar10 + 3) = 0;
  puVar10[5] = 0;
  iVar15 = local_3a0.y;
  if (local_3a0.y < local_3a0.x) {
    iVar15 = local_3a0.x;
  }
  uVar11 = (int)(iVar15 - 1U) >> 1 | iVar15 - 1U;
  uVar11 = (int)uVar11 >> 2 | uVar11;
  uVar11 = (int)uVar11 >> 4 | uVar11;
  uVar11 = (int)uVar11 >> 8 | uVar11;
  puVar10[1] = ((int)uVar11 >> 0x10 | uVar11) + 1;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)puVar10 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&local_398,(SamplerHandle *)&local_338);
  local_360 = (Tuple2<pbrt::Point2,_float> *)
              local_398.
              super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pTVar19 = (Tuple2<pbrt::Point2,_float> *)
            local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar12 = 0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      uStack_1e0 = 0;
      uStack_1d8 = 0;
      alStack_1d0[0] = 0;
      alStack_1d0[1] = 0;
      alStack_1d0[2] = 0;
      local_238 = 0;
      uStack_230 = 0;
      uStack_228 = 0;
      uStack_220 = 0;
      uStack_218 = 0;
      uStack_210 = 0;
      uStack_208 = 0;
      uStack_200 = 0;
      local_278 = 0;
      uStack_270 = 0;
      uStack_268 = 0;
      uStack_260 = 0;
      uStack_258 = 0;
      uStack_250 = 0;
      uStack_248 = 0;
      uStack_240 = 0;
      local_2b8 = 0;
      uStack_2b0 = 0;
      uStack_2a8 = 0;
      uStack_2a0 = 0;
      uStack_298 = 0;
      uStack_290 = 0;
      uStack_288 = 0;
      uStack_280 = 0;
      local_2f8 = 0;
      uStack_2f0 = 0;
      uStack_2e8 = 0;
      uStack_2e0 = 0;
      uStack_2d8 = 0;
      uStack_2d0 = 0;
      uStack_2c8 = 0;
      uStack_2c0 = 0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uStack_320 = 0;
      uStack_318 = 0;
      uStack_310 = 0;
      uStack_308 = 0;
      uStack_300 = 0;
      local_1b8[0x28] = 0;
      local_1b8[0x29] = 0;
      local_1b8[0x2a] = 0;
      local_1b8[0x2b] = 0;
      local_1b8[0x2c] = 0;
      local_1b8[0x2d] = 0;
      local_1b8[0x2e] = 0;
      local_1b8[0x2f] = 0;
      local_1b8[0x20] = 0;
      local_1b8[0x21] = 0;
      local_1b8[0x22] = 0;
      local_1b8[0x23] = 0;
      local_1b8[0x24] = 0;
      local_1b8[0x25] = 0;
      local_1b8[0x26] = 0;
      local_1b8[0x27] = 0;
      local_1b8[0x18] = 0;
      local_1b8[0x19] = 0;
      local_1b8[0x1a] = 0;
      local_1b8[0x1b] = 0;
      local_1b8[0x1c] = 0;
      local_1b8[0x1d] = 0;
      local_1b8[0x1e] = 0;
      local_1b8[0x1f] = 0;
      local_1b8[0x10] = 0;
      local_1b8[0x11] = 0;
      local_1b8[0x12] = 0;
      local_1b8[0x13] = 0;
      local_1b8[0x14] = 0;
      local_1b8[0x15] = 0;
      local_1b8[0x16] = 0;
      local_1b8[0x17] = 0;
      local_1b8[8] = 0;
      local_1b8[9] = 0;
      local_1b8[10] = 0;
      local_1b8[0xb] = 0;
      local_1b8[0xc] = 0;
      local_1b8[0xd] = 0;
      local_1b8[0xe] = 0;
      local_1b8[0xf] = 0;
      local_1b8[0] = 0;
      local_1b8[1] = 0;
      local_1b8[2] = 0;
      local_1b8[3] = 0;
      local_1b8[4] = 0;
      local_1b8[5] = 0;
      local_1b8[6] = 0;
      local_1b8[7] = 0;
      do {
        sStack_3b0.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
        local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
        local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
        local_3cc = SUB84(lVar12,0);
        local_3bc = 0;
        AStack_3c8.data_ = (AssertHelperData *)0x500000001;
        local_3a8 = &local_3bc;
        local_3d8 = *pTVar19;
        pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
        iVar15 = 10;
        do {
          TVar2 = *pTVar19;
          uVar11 = (uint)TVar2.y._2_2_;
          if ((ulong)TVar2 < 0x5000000000000) {
            if ((ulong)TVar2 < 0x3000000000000) {
              if (uVar11 == 2) {
                auVar22._0_8_ =
                     pbrt::PaddedSobolSampler::Get2D
                               ((PaddedSobolSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar22._8_56_ = extraout_var_01;
                auVar21 = auVar22._0_16_;
              }
              else {
                auVar26._0_8_ =
                     pbrt::HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar26._8_56_ = extraout_var_05;
                auVar21 = auVar26._0_16_;
              }
            }
            else if ((uVar11 & 6) == 2) {
              auVar24._0_8_ =
                   pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar2 & 0xffffffffffff));
              auVar24._8_56_ = extraout_var_03;
              auVar21 = auVar24._0_16_;
            }
            else {
              auVar28._0_8_ =
                   pbrt::RandomSampler::Get2D((RandomSampler *)((ulong)TVar2 & 0xffffffffffff));
              auVar28._8_56_ = extraout_var_07;
              auVar21 = auVar28._0_16_;
            }
          }
          else {
            uVar11 = uVar11 - 4;
            if (uVar11 < 3) {
              if (uVar11 == 2) {
                auVar23._0_8_ =
                     pbrt::StratifiedSampler::Get2D
                               ((StratifiedSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar23._8_56_ = extraout_var_02;
                auVar21 = auVar23._0_16_;
              }
              else {
                auVar27._0_8_ =
                     pbrt::SobolSampler::Get2D((SobolSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar27._8_56_ = extraout_var_06;
                auVar21 = auVar27._0_16_;
              }
            }
            else {
              pDVar17 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
              if ((uVar11 & 0x7ffffffe) == 2) {
                auVar25._0_8_ = pbrt::MLTSampler::Get2D((MLTSampler *)pDVar17);
                auVar25._8_56_ = extraout_var_04;
                auVar21 = auVar25._0_16_;
              }
              else {
                FVar20 = pbrt::DebugMLTSampler::Get1D(pDVar17);
                local_378._0_4_ = FVar20;
                local_378._4_4_ = extraout_XMM0_Db;
                uStack_370 = extraout_XMM0_Dc;
                uStack_36c = extraout_XMM0_Dd;
                auVar29._0_4_ = pbrt::DebugMLTSampler::Get1D(pDVar17);
                auVar29._4_60_ = extraout_var;
                auVar21._8_4_ = uStack_370;
                auVar21._0_8_ = local_378;
                auVar21._12_4_ = uStack_36c;
                auVar21 = vinsertps_avx(auVar21,auVar29._0_16_,0x10);
              }
            }
          }
          uVar1 = vmovlps_avx(auVar21);
          local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(uVar1,0);
          local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)uVar1 >> 8,0);
          std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
          emplace_back<pbrt::Point2<float>>
                    ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)
                     (local_1b8 + lVar12 * 3),&local_3b8);
          TVar2 = *pTVar19;
          local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = TVar2.x._0_1_;
          local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = TVar2._1_7_;
          FVar20 = pbrt::detail::DispatchSplit<8>::operator()
                             ((DispatchSplit<8> *)&AStack_3c8,&local_3b8,(ulong)TVar2 >> 0x30);
          __position._M_current =
               (&local_338)[lVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_3d8.x = FVar20;
          if (__position._M_current ==
              (&local_338)[lVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_338 + lVar12,__position,&local_3d8.x);
          }
          else {
            *__position._M_current = FVar20;
            (&local_338)[lVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
      sStack_3b0.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
      local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
      local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
      local_3cc = (undefined1  [4])0xa;
      local_3bc = 0;
      AStack_3c8.data_ = (AssertHelperData *)0x600000000;
      local_3a8 = &local_3bc;
      local_3d8 = *pTVar19;
      pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
      TVar2 = *pTVar19;
      uVar11 = (uint)TVar2.y._2_2_;
      if ((ulong)TVar2 < 0x5000000000000) {
        if ((ulong)TVar2 < 0x3000000000000) {
          if (uVar11 == 2) {
            pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
          else {
            pbrt::HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
        }
        else if ((uVar11 & 6) == 2) {
          pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar2 & 0xffffffffffff));
        }
        else {
          pbrt::RandomSampler::Get2D((RandomSampler *)((ulong)TVar2 & 0xffffffffffff));
        }
      }
      else {
        uVar11 = uVar11 - 4;
        if (uVar11 < 3) {
          if (uVar11 == 2) {
            pbrt::StratifiedSampler::Get2D((StratifiedSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
          else {
            pbrt::SobolSampler::Get2D((SobolSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
        }
        else {
          pDVar17 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
          if ((uVar11 & 0x7ffffffe) == 2) {
            pbrt::MLTSampler::Get2D((MLTSampler *)pDVar17);
          }
          else {
            pbrt::DebugMLTSampler::Get1D(pDVar17);
            pbrt::DebugMLTSampler::Get1D(pDVar17);
          }
        }
      }
      TVar2 = *pTVar19;
      uVar11 = (uint)TVar2.y._2_2_;
      if ((ulong)TVar2 < 0x5000000000000) {
        if ((ulong)TVar2 < 0x3000000000000) {
          if (uVar11 == 2) {
            pbrt::PaddedSobolSampler::Get2D((PaddedSobolSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
          else {
            pbrt::HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
        }
        else if ((uVar11 & 6) == 2) {
          pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar2 & 0xffffffffffff));
        }
        else {
          pbrt::RandomSampler::Get2D((RandomSampler *)((ulong)TVar2 & 0xffffffffffff));
        }
      }
      else {
        uVar11 = uVar11 - 4;
        if (uVar11 < 3) {
          if (uVar11 == 2) {
            pbrt::StratifiedSampler::Get2D((StratifiedSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
          else {
            pbrt::SobolSampler::Get2D((SobolSampler *)((ulong)TVar2 & 0xffffffffffff));
          }
        }
        else {
          pDVar17 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
          if ((uVar11 & 0x7ffffffe) == 2) {
            pbrt::MLTSampler::Get2D((MLTSampler *)pDVar17);
          }
          else {
            pbrt::DebugMLTSampler::Get1D(pDVar17);
            pbrt::DebugMLTSampler::Get1D(pDVar17);
          }
        }
      }
      TVar2 = *pTVar19;
      local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = TVar2.x._0_1_;
      local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = TVar2._1_7_;
      pbrt::detail::DispatchSplit<8>::operator()
                ((DispatchSplit<8> *)&local_3d8,&local_3b8,(ulong)TVar2 >> 0x30);
      lVar12 = 0xf;
      do {
        sStack_3b0.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3cc;
        local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ = SUB81(&AStack_3c8,0);
        local_3b8.super_Tuple2<pbrt::Point2,_float>._1_7_ = SUB87((ulong)&AStack_3c8 >> 8,0);
        local_3cc = SUB84(lVar12,0);
        local_3bc = 0;
        AStack_3c8.data_ = (AssertHelperData *)0x500000001;
        local_3a8 = &local_3bc;
        local_3d8 = *pTVar19;
        pbrt::detail::DispatchSplit<8>::operator()(&local_3cd,&local_3d8,(ulong)local_3d8 >> 0x30);
        lVar18 = local_1b8[lVar12 * 3];
        local_358 = lVar12;
        if (local_1b8[lVar12 * 3 + 1] != lVar18) {
          local_350 = local_1b8 + lVar12 * 3;
          local_378 = &local_338 + lVar12;
          lVar12 = 0;
          lVar16 = 0;
          uVar13 = 0;
          do {
            TVar2 = *pTVar19;
            uVar11 = (uint)TVar2.y._2_2_;
            if ((ulong)TVar2 < 0x5000000000000) {
              if ((ulong)TVar2 < 0x3000000000000) {
                if (uVar11 == 2) {
                  auVar30._0_8_ =
                       pbrt::PaddedSobolSampler::Get2D
                                 ((PaddedSobolSampler *)((ulong)TVar2 & 0xffffffffffff));
                  auVar30._8_56_ = extraout_var_08;
                  auVar21 = auVar30._0_16_;
                }
                else {
                  auVar34._0_8_ =
                       pbrt::HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar2 & 0xffffffffffff));
                  auVar34._8_56_ = extraout_var_12;
                  auVar21 = auVar34._0_16_;
                }
              }
              else if ((uVar11 & 6) == 2) {
                auVar32._0_8_ =
                     pbrt::PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar32._8_56_ = extraout_var_10;
                auVar21 = auVar32._0_16_;
              }
              else {
                auVar36._0_8_ =
                     pbrt::RandomSampler::Get2D((RandomSampler *)((ulong)TVar2 & 0xffffffffffff));
                auVar36._8_56_ = extraout_var_14;
                auVar21 = auVar36._0_16_;
              }
            }
            else {
              uVar11 = uVar11 - 4;
              if (uVar11 < 3) {
                if (uVar11 == 2) {
                  auVar31._0_8_ =
                       pbrt::StratifiedSampler::Get2D
                                 ((StratifiedSampler *)((ulong)TVar2 & 0xffffffffffff));
                  auVar31._8_56_ = extraout_var_09;
                  auVar21 = auVar31._0_16_;
                }
                else {
                  auVar35._0_8_ =
                       pbrt::SobolSampler::Get2D((SobolSampler *)((ulong)TVar2 & 0xffffffffffff));
                  auVar35._8_56_ = extraout_var_13;
                  auVar21 = auVar35._0_16_;
                }
              }
              else {
                pDVar17 = (DebugMLTSampler *)((ulong)TVar2 & 0xffffffffffff);
                if ((uVar11 & 0x7ffffffe) == 2) {
                  auVar33._0_8_ = pbrt::MLTSampler::Get2D((MLTSampler *)pDVar17);
                  auVar33._8_56_ = extraout_var_11;
                  auVar21 = auVar33._0_16_;
                }
                else {
                  local_348 = pbrt::DebugMLTSampler::Get1D(pDVar17);
                  uStack_344 = extraout_XMM0_Db_00;
                  uStack_340 = extraout_XMM0_Dc_00;
                  uStack_33c = extraout_XMM0_Dd_00;
                  auVar37._0_4_ = pbrt::DebugMLTSampler::Get1D(pDVar17);
                  auVar37._4_60_ = extraout_var_00;
                  auVar5._4_4_ = uStack_344;
                  auVar5._0_4_ = local_348;
                  auVar5._8_4_ = uStack_340;
                  auVar5._12_4_ = uStack_33c;
                  auVar21 = vinsertps_avx(auVar5,auVar37._0_16_,0x10);
                }
              }
            }
            local_3d8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar21);
            testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
                      ((internal *)&local_3b8,"s2d[s][i]","sampler.Get2D()",
                       (Point2<float> *)(lVar18 + lVar12),(Point2<float> *)&local_3d8);
            if (local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_3d8);
              pcVar14 = "";
              if (sStack_3b0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = ((sStack_3b0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers_test.cpp"
                         ,0x3c,pcVar14);
              testing::internal::AssertHelper::operator=(&AStack_3c8,(Message *)&local_3d8);
              testing::internal::AssertHelper::~AssertHelper(&AStack_3c8);
              if (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0) {
                bVar6 = testing::internal::IsTrue(true);
                if ((bVar6) && (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0)) {
                  (**(code **)(*(long *)local_3d8 + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&sStack_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3d8 = *pTVar19;
            pfVar3 = (local_378->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            FVar20 = pbrt::detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)local_3cc,&local_3d8,(ulong)local_3d8 >> 0x30);
            AStack_3c8.data_._0_4_ = FVar20;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_3b8,"s1d[s][i]","sampler.Get1D()",
                       (float *)((long)pfVar3 + lVar16),(float *)&AStack_3c8);
            if (local_3b8.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_3d8);
              pcVar14 = "";
              if (sStack_3b0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = ((sStack_3b0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers_test.cpp"
                         ,0x3d,pcVar14);
              testing::internal::AssertHelper::operator=(&AStack_3c8,(Message *)&local_3d8);
              testing::internal::AssertHelper::~AssertHelper(&AStack_3c8);
              if (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0) {
                bVar6 = testing::internal::IsTrue(true);
                if ((bVar6) && (local_3d8 != (Tuple2<pbrt::Point2,_float>)0x0)) {
                  (**(code **)(*(long *)local_3d8 + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&sStack_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar13 = uVar13 + 1;
            lVar16 = lVar16 + 4;
            lVar12 = lVar12 + 8;
            lVar18 = *local_350;
          } while (uVar13 < (ulong)(local_350[1] - lVar18 >> 3));
        }
        lVar12 = local_358 + -1;
      } while (local_358 != 0);
      lVar12 = 0x180;
      do {
        pvVar4 = *(void **)((long)alStack_1d0 + lVar12);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)alStack_1d0 + lVar12 + 0x10) - (long)pvVar4);
        }
        lVar12 = lVar12 + -0x18;
      } while (lVar12 != 0);
      lVar12 = 0x180;
      do {
        pvVar4 = *(void **)((long)&local_350 + lVar12);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)&uStack_340 + lVar12) - (long)pvVar4);
        }
        lVar12 = lVar12 + -0x18;
      } while (lVar12 != 0);
      pTVar19 = pTVar19 + 1;
    } while (pTVar19 != local_360);
  }
  if ((Tuple2<pbrt::Point2,_float> *)
      local_398.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (Tuple2<pbrt::Point2,_float> *)0x0) {
    operator_delete(local_398.
                    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Sampler, ConsistentValues) {
    constexpr int rootSpp = 4;
    constexpr int spp = rootSpp * rootSpp;
    Point2i resolution(100, 101);

    std::vector<SamplerHandle> samplers;
    samplers.push_back(new HaltonSampler(spp, resolution));
    samplers.push_back(new RandomSampler(spp));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::None));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Xor));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Owen));
    samplers.push_back(new PMJ02BNSampler(spp));
    samplers.push_back(new StratifiedSampler(rootSpp, rootSpp, true));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::None));
    samplers.push_back(
        new SobolSampler(spp, resolution, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Xor));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Owen));

    for (auto &sampler : samplers) {
        std::vector<Float> s1d[spp];
        std::vector<Point2f> s2d[spp];

        for (int s = 0; s < spp; ++s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < 10; ++i) {
                s2d[s].push_back(sampler.Get2D());
                s1d[s].push_back(sampler.Get1D());
            }
        }

        // Go somewhere else and generate some samples, just to make sure
        // things are shaken up.
        sampler.StartPixelSample({0, 6}, 10);
        sampler.Get2D();
        sampler.Get2D();
        sampler.Get1D();

        // Now go back and generate samples again, but enumerate them in a
        // different order to make sure the sampler is doing the right
        // thing.
        for (int s = spp - 1; s >= 0; --s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < s2d[s].size(); ++i) {
                EXPECT_EQ(s2d[s][i], sampler.Get2D());
                EXPECT_EQ(s1d[s][i], sampler.Get1D());
            }
        }
    }
}